

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canceled.c
# Opt level: O0

rxc_sink * rxc_sink_canceled(void)

{
  rxc_sink *sink;
  
  sink = (rxc_sink *)malloc(0x10);
  if (sink == (rxc_sink *)0x0) {
    sink = (rxc_sink *)0x0;
  }
  else {
    sink->dealloc = dealloc;
    sink->create_logic = create_logic;
  }
  return sink;
}

Assistant:

struct rxc_sink * rxc_sink_canceled()
{
    struct rxc_sink *sink = malloc(sizeof(struct rxc_sink));

    if (!sink) {
        return NULL;
    }

    sink->dealloc = dealloc;
    sink->create_logic = create_logic;

    return sink;
}